

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alGetSourcefv(ALuint name,ALenum param,ALfloat *values)

{
  uint local_20;
  uint local_1c;
  uint32 i;
  uint32 numvals;
  ALfloat *values_local;
  ALenum param_local;
  ALuint name_local;
  
  local_1c = 1;
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetSourcefv);
  IO_UINT32(name);
  IO_ENUM(param);
  IO_PTR(values);
  switch(param) {
  case 0x1001:
    break;
  case 0x1002:
    break;
  case 0x1003:
    break;
  case 0x1004:
    local_1c = 3;
    break;
  case 0x1005:
    local_1c = 3;
    break;
  case 0x1006:
    local_1c = 3;
    break;
  default:
    local_1c = 0;
    break;
  case 0x100a:
    break;
  case 0x100d:
    break;
  case 0x100e:
    break;
  case 0x1020:
    break;
  case 0x1021:
    break;
  case 0x1022:
    break;
  case 0x1023:
    break;
  case 0x1024:
    break;
  case 0x1025:
    break;
  case 0x1026:
  }
  if (values == (ALfloat *)0x0) {
    local_1c = 0;
  }
  if (local_1c != 0) {
    memset(values,0,(ulong)local_1c << 2);
  }
  (*REAL_alGetSourcefv)(name,param,values);
  IO_UINT32(local_1c);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    IO_FLOAT(values[local_20]);
  }
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetSourcefv(ALuint name, ALenum param, ALfloat *values)
{
    uint32 numvals = 1;
    uint32 i;
    IO_START(alGetSourcefv);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_PTR(values);

    switch (param) {
        case AL_GAIN: break;
        case AL_POSITION: numvals = 3; break;
        case AL_VELOCITY: numvals = 3; break;
        case AL_DIRECTION: numvals = 3; break;
        case AL_MIN_GAIN: break;
        case AL_MAX_GAIN: break;
        case AL_REFERENCE_DISTANCE: break;
        case AL_ROLLOFF_FACTOR: break;
        case AL_MAX_DISTANCE: break;
        case AL_PITCH: break;
        case AL_CONE_INNER_ANGLE: break;
        case AL_CONE_OUTER_ANGLE: break;
        case AL_CONE_OUTER_GAIN: break;
        case AL_SEC_OFFSET: break;
        case AL_SAMPLE_OFFSET: break;
        case AL_BYTE_OFFSET: break;
        default: numvals = 0; break;   /* uhoh. */
    }

    if (!values) { numvals = 0; }
    if (numvals) {
        memset(values, '\0', numvals * sizeof (ALfloat));
    }

    REAL_alGetSourcefv(name, param, values);

    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_FLOAT(values[i]);
    }

    IO_END();
}